

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMocker<solitaire::interfaces::Button_&()>::PerformDefaultAction
          (FunctionMocker<solitaire::interfaces::Button_&()> *this,ArgumentTuple *args,
          string *call_description)

{
  OnCallSpec<solitaire::interfaces::Button_&()> *this_00;
  Action<solitaire::interfaces::Button_&()> *pAVar1;
  Result pBVar2;
  Button *pBVar3;
  runtime_error *this_01;
  string message;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<solitaire::interfaces::Button_&()> *)0x0) {
    pAVar1 = OnCallSpec<solitaire::interfaces::Button_&()>::GetAction(this_00);
    pBVar2 = Action<solitaire::interfaces::Button_&()>::Perform(pAVar1);
    return pBVar2;
  }
  std::operator+(&message,call_description,
                 "\n    The mock function has no default action set, and its return type has no default value set."
                );
  if (DefaultValue<solitaire::interfaces::Button&>::address_ != 0) {
    pBVar3 = DefaultValue<solitaire::interfaces::Button_&>::Get();
    std::__cxx11::string::~string((string *)&message);
    return pBVar3;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,(string *)&message);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }